

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

void new_ascii_string(vm_val_t *ret,char *str)

{
  long lVar1;
  vm_obj_id_t vVar2;
  size_t bytelen;
  size_t sVar3;
  
  bytelen = strlen(str);
  vVar2 = CVmObjString::create(0,str,bytelen);
  ret->typ = VM_OBJ;
  (ret->val).obj = vVar2;
  if (bytelen != 0) {
    lVar1 = *(long *)((long)&G_obj_table_X.pages_[vVar2 >> 0xc][vVar2 & 0xfff].ptr_ + 8);
    sVar3 = 0;
    do {
      if (*(char *)(lVar1 + 2 + sVar3) < '\0') {
        *(undefined1 *)(lVar1 + 2 + sVar3) = 0x3f;
      }
      sVar3 = sVar3 + 1;
    } while (bytelen != sVar3);
  }
  return;
}

Assistant:

static void new_ascii_string(VMG_ vm_val_t *ret, const char *str)
{
    return new_ascii_string(vmg_ ret, str, strlen(str));
}